

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile.c
# Opt level: O2

LY_ERR lys_compile(lys_module *mod,lys_depset_unres *unres)

{
  void **ppvVar1;
  lysp_submodule *plVar2;
  ly_ctx *ctx;
  lysp_node *plVar3;
  lysp_node_action *plVar4;
  lysp_node_notif *plVar5;
  lysc_ext_instance *plVar6;
  lysp_ext_instance *plVar7;
  lysp_include *plVar8;
  lysp_submodule *plVar9;
  lyd_node *plVar10;
  lysc_node *plVar11;
  lys_module *plVar12;
  LY_ERR LVar13;
  lysc_module *module;
  long *plVar14;
  lysp_ext_instance *plVar15;
  lysp_ext_instance *plVar16;
  lysp_node_grp *plVar17;
  char **ppcVar18;
  ulong uVar19;
  char *pcVar20;
  undefined8 uVar21;
  lysp_node_action **pplVar22;
  lysp_node_notif **pplVar23;
  lysp_node **pplVar24;
  long lVar25;
  lysp_node_grp **pplVar26;
  ulong uVar27;
  void *pvVar28;
  long lVar29;
  ulong local_10e8;
  lysp_node **local_10e0;
  lysc_ctx local_10d0;
  
  memset(&local_10d0,0,0x10a0);
  if (mod == (lys_module *)0x0) {
    pcVar20 = "mod";
LAB_0013ed1f:
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).",pcVar20,"lys_compile");
    return LY_EINVAL;
  }
  plVar2 = (lysp_submodule *)mod->parsed;
  if (plVar2 == (lysp_submodule *)0x0) {
    pcVar20 = "mod->parsed";
    goto LAB_0013ed1f;
  }
  if (mod->compiled != (lysc_module *)0x0) {
    pcVar20 = "!mod->compiled";
    goto LAB_0013ed1f;
  }
  ctx = mod->ctx;
  if (ctx == (ly_ctx *)0x0) {
    pcVar20 = "mod->ctx";
    goto LAB_0013ed1f;
  }
  if ((mod->implemented == '\0') || (mod->to_compile == '\0')) {
    __assert_fail("mod->implemented && mod->to_compile",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_compile.c"
                  ,0x6b2,"LY_ERR lys_compile(struct lys_module *, struct lys_depset_unres *)");
  }
  local_10d0.cur_mod = plVar2->mod;
  local_10d0.ctx = (local_10d0.cur_mod)->ctx;
  local_10d0.path_len = 1;
  local_10d0.path[0] = '/';
  local_10d0.free_ctx.ctx = plVar2->mod->ctx;
  ctx->change_count = ctx->change_count + 1;
  local_10d0.pmod = (lysp_module *)plVar2;
  local_10d0.unres = unres;
  module = (lysc_module *)calloc(1,0x28);
  mod->compiled = module;
  if (module == (lysc_module *)0x0) {
    ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lys_compile");
    return LY_EMEM;
  }
  module->mod = mod;
  LVar13 = lys_precompile_own_augments(&local_10d0);
  if ((LVar13 == LY_SUCCESS) &&
     (LVar13 = lys_precompile_own_deviations(&local_10d0), LVar13 == LY_SUCCESS)) {
    local_10e0 = &plVar2->data;
    pplVar24 = local_10e0;
    do {
      plVar3 = *pplVar24;
      if (plVar3 == (lysp_node *)0x0) {
        pplVar22 = &plVar2->rpcs;
        goto LAB_0013ee6c;
      }
      LVar13 = lys_compile_node(&local_10d0,plVar3,(lysc_node *)0x0,0,(ly_set *)0x0);
      pplVar24 = &plVar3->next;
    } while (LVar13 == LY_SUCCESS);
  }
  goto LAB_0013ee95;
  while( true ) {
    LVar13 = lys_compile_node(&local_10d0,(lysp_node *)plVar4,(lysc_node *)0x0,0,(ly_set *)0x0);
    pplVar22 = (lysp_node_action **)&(plVar4->field_0).node.next;
    if (LVar13 != LY_SUCCESS) break;
LAB_0013ee6c:
    plVar4 = *pplVar22;
    if (plVar4 == (lysp_node_action *)0x0) {
      pplVar23 = &plVar2->notifs;
      goto LAB_0013f04f;
    }
  }
  goto LAB_0013ee95;
  while( true ) {
    LVar13 = lys_compile_node(&local_10d0,(lysp_node *)plVar5,(lysc_node *)0x0,0,(ly_set *)0x0);
    pplVar23 = (lysp_node_notif **)&(plVar5->field_0).node.next;
    if (LVar13 != LY_SUCCESS) break;
LAB_0013f04f:
    plVar5 = *pplVar23;
    if (plVar5 == (lysp_node_notif *)0x0) {
      plVar15 = plVar2->exts;
      if (plVar15 == (lysp_ext_instance *)0x0) goto LAB_0013f19f;
      plVar6 = module->exts;
      if (plVar6 == (lysc_ext_instance *)0x0) {
        plVar14 = (long *)calloc(1,(long)plVar15[-1].exts * 0x48 + 8);
        if (plVar14 == (long *)0x0) goto LAB_0013f399;
        lVar29 = 0;
        pvVar28 = (void *)0x0;
      }
      else {
        pvVar28 = plVar6[-1].compiled;
        plVar14 = (long *)realloc(&plVar6[-1].compiled,
                                  ((long)&(plVar15[-1].exts)->name + (long)pvVar28 * 2) * 0x48 + 8);
        if (plVar14 == (long *)0x0) goto LAB_0013f399;
        lVar29 = *plVar14;
      }
      module->exts = (lysc_ext_instance *)(plVar14 + 1);
      if (plVar2->exts == (lysp_ext_instance *)0x0) {
        plVar15 = (lysp_ext_instance *)0x0;
      }
      else {
        plVar15 = plVar2->exts[-1].exts;
      }
      lVar25 = 0;
      memset(plVar14 + lVar29 * 9 + 1,0,((long)&plVar15->name + (long)pvVar28) * 0x48);
      plVar15 = (lysp_ext_instance *)0x0;
      goto LAB_0013f13f;
    }
  }
  goto LAB_0013ee95;
LAB_0013f13f:
  plVar7 = plVar2->exts;
  if (plVar7 == (lysp_ext_instance *)0x0) {
    plVar16 = (lysp_ext_instance *)0x0;
  }
  else {
    plVar16 = plVar7[-1].exts;
  }
  if (plVar16 <= plVar15) goto LAB_0013f19f;
  plVar6 = module->exts;
  pvVar28 = plVar6[-1].compiled;
  plVar6[-1].compiled = (void *)((long)pvVar28 + 1);
  LVar13 = lys_compile_ext(&local_10d0,(lysp_ext_instance *)((long)&plVar7->name + lVar25),
                           plVar6 + (long)pvVar28,module);
  if (LVar13 != LY_SUCCESS) {
    if (LVar13 != LY_ENOT) goto LAB_0013ee95;
    ppvVar1 = &module->exts[-1].compiled;
    *ppvVar1 = (void *)((long)*ppvVar1 + -1);
  }
  plVar15 = (lysp_ext_instance *)((long)&plVar15->name + 1);
  lVar25 = lVar25 + 0x70;
  goto LAB_0013f13f;
LAB_0013f399:
  LVar13 = LY_EMEM;
  ly_log(local_10d0.ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lys_compile");
  goto LAB_0013ee95;
LAB_0013f19f:
  uVar27 = 0;
  while( true ) {
    plVar8 = plVar2->includes;
    if (plVar8 == (lysp_include *)0x0) {
      uVar19 = 0;
    }
    else {
      uVar19 = *(ulong *)(plVar8[-1].rev + 8);
    }
    if (uVar19 <= uVar27) break;
    plVar9 = plVar8[uVar27].submodule;
    pplVar24 = &plVar9->data;
    local_10d0.pmod = (lysp_module *)plVar9;
    while (plVar3 = *pplVar24, plVar3 != (lysp_node *)0x0) {
      LVar13 = lys_compile_node(&local_10d0,plVar3,(lysc_node *)0x0,0,(ly_set *)0x0);
      pplVar24 = &plVar3->next;
      if (LVar13 != LY_SUCCESS) goto LAB_0013ee95;
    }
    pplVar22 = &plVar9->rpcs;
    while (plVar4 = *pplVar22, plVar4 != (lysp_node_action *)0x0) {
      LVar13 = lys_compile_node(&local_10d0,(lysp_node *)plVar4,(lysc_node *)0x0,0,(ly_set *)0x0);
      pplVar22 = (lysp_node_action **)&(plVar4->field_0).node.next;
      if (LVar13 != LY_SUCCESS) goto LAB_0013ee95;
    }
    pplVar23 = &plVar9->notifs;
    while (plVar5 = *pplVar23, plVar5 != (lysp_node_notif *)0x0) {
      LVar13 = lys_compile_node(&local_10d0,(lysp_node *)plVar5,(lysc_node *)0x0,0,(ly_set *)0x0);
      pplVar23 = (lysp_node_notif **)&(plVar5->field_0).node.next;
      if (LVar13 != LY_SUCCESS) goto LAB_0013ee95;
    }
    plVar15 = plVar9->exts;
    if (plVar15 != (lysp_ext_instance *)0x0) {
      plVar6 = module->exts;
      if (plVar6 == (lysc_ext_instance *)0x0) {
        plVar14 = (long *)calloc(1,(long)plVar15[-1].exts * 0x48 + 8);
        if (plVar14 == (long *)0x0) goto LAB_0013f399;
        lVar29 = 0;
        pvVar28 = (void *)0x0;
      }
      else {
        pvVar28 = plVar6[-1].compiled;
        plVar14 = (long *)realloc(&plVar6[-1].compiled,
                                  ((long)&(plVar15[-1].exts)->name + (long)pvVar28 * 2) * 0x48 + 8);
        if (plVar14 == (long *)0x0) goto LAB_0013f399;
        lVar29 = *plVar14;
      }
      module->exts = (lysc_ext_instance *)(plVar14 + 1);
      if (plVar9->exts == (lysp_ext_instance *)0x0) {
        plVar15 = (lysp_ext_instance *)0x0;
      }
      else {
        plVar15 = plVar9->exts[-1].exts;
      }
      memset(plVar14 + lVar29 * 9 + 1,0,((long)&plVar15->name + (long)pvVar28) * 0x48);
      lVar29 = 0;
      plVar15 = (lysp_ext_instance *)0x0;
      while( true ) {
        plVar7 = plVar9->exts;
        if (plVar7 == (lysp_ext_instance *)0x0) {
          plVar16 = (lysp_ext_instance *)0x0;
        }
        else {
          plVar16 = plVar7[-1].exts;
        }
        if (plVar16 <= plVar15) break;
        plVar6 = module->exts;
        pvVar28 = plVar6[-1].compiled;
        plVar6[-1].compiled = (void *)((long)pvVar28 + 1);
        LVar13 = lys_compile_ext(&local_10d0,(lysp_ext_instance *)((long)&plVar7->name + lVar29),
                                 plVar6 + (long)pvVar28,module);
        if (LVar13 != LY_SUCCESS) {
          if (LVar13 != LY_ENOT) goto LAB_0013ee95;
          ppvVar1 = &module->exts[-1].compiled;
          *ppvVar1 = (void *)((long)*ppvVar1 + -1);
        }
        plVar15 = (lysp_ext_instance *)((long)&plVar15->name + 1);
        lVar29 = lVar29 + 0x70;
      }
    }
    uVar27 = uVar27 + 1;
  }
  local_10d0.compile_opts._0_1_ = (byte)local_10d0.compile_opts | 1;
  pplVar26 = &plVar2->groupings;
  local_10d0.pmod = (lysp_module *)plVar2;
  while (plVar17 = *pplVar26, plVar17 != (lysp_node_grp *)0x0) {
    if (((undefined1  [64])((undefined1  [64])plVar17->field_0 & (undefined1  [64])0x4000000) ==
         (undefined1  [64])0x0) &&
       (LVar13 = lys_compile_grouping(&local_10d0,(lysp_node *)0x0,plVar17), LVar13 != LY_SUCCESS))
    goto LAB_0013ee95;
    pplVar26 = &(plVar17->field_0).field_1.next;
  }
  while (plVar3 = *local_10e0, plVar3 != (lysp_node *)0x0) {
    for (plVar17 = lysp_node_groupings(plVar3); plVar17 != (lysp_node_grp *)0x0;
        plVar17 = (plVar17->field_0).field_1.next) {
      if (((undefined1  [64])((undefined1  [64])plVar17->field_0 & (undefined1  [64])0x4000000) ==
           (undefined1  [64])0x0) &&
         (LVar13 = lys_compile_grouping(&local_10d0,plVar3,plVar17), LVar13 != LY_SUCCESS))
      goto LAB_0013ee95;
    }
    local_10e0 = &plVar3->next;
  }
  local_10e8 = 0;
  while( true ) {
    plVar8 = plVar2->includes;
    if (plVar8 == (lysp_include *)0x0) {
      uVar27 = 0;
    }
    else {
      uVar27 = *(ulong *)(plVar8[-1].rev + 8);
    }
    if (uVar27 <= local_10e8) break;
    plVar9 = plVar8[local_10e8].submodule;
    pplVar26 = &plVar9->groupings;
    local_10d0.pmod = (lysp_module *)plVar9;
    while (plVar17 = *pplVar26, plVar17 != (lysp_node_grp *)0x0) {
      if (((undefined1  [64])((undefined1  [64])plVar17->field_0 & (undefined1  [64])0x4000000) ==
           (undefined1  [64])0x0) &&
         (LVar13 = lys_compile_grouping(&local_10d0,(lysp_node *)0x0,plVar17), LVar13 != LY_SUCCESS)
         ) goto LAB_0013ee95;
      pplVar26 = &(plVar17->field_0).field_1.next;
    }
    pplVar24 = &plVar9->data;
    while (plVar3 = *pplVar24, plVar3 != (lysp_node *)0x0) {
      for (plVar17 = lysp_node_groupings(plVar3); plVar17 != (lysp_node_grp *)0x0;
          plVar17 = (plVar17->field_0).field_1.next) {
        if (((undefined1  [64])((undefined1  [64])plVar17->field_0 & (undefined1  [64])0x4000000) ==
             (undefined1  [64])0x0) &&
           (LVar13 = lys_compile_grouping(&local_10d0,plVar3,plVar17), LVar13 != LY_SUCCESS))
        goto LAB_0013ee95;
      }
      pplVar24 = &plVar3->next;
    }
    local_10e8 = local_10e8 + 1;
  }
  local_10d0.pmod = (lysp_module *)plVar2;
  ly_log_location_revert(0,0,1,0);
  plVar12 = local_10d0.cur_mod;
  for (uVar27 = 0; uVar27 < local_10d0.augs.count; uVar27 = uVar27 + 1) {
    plVar10 = local_10d0.augs.field_2.dnodes[uVar27];
    local_10d0.cur_mod = *(lys_module **)plVar10->schema;
    if (plVar10->next != (lyd_node *)0x0) {
      lysc_update_path(&local_10d0,(lys_module *)0x0,"{extension}");
      lysc_update_path(&local_10d0,(lys_module *)0x0,*(char **)plVar10->next);
    }
    lysc_update_path(&local_10d0,(lys_module *)0x0,"{augment}");
    lysc_update_path(&local_10d0,(lys_module *)0x0,(char *)**(undefined8 **)plVar10);
    pcVar20 = " extension";
    if (plVar10->next == (lyd_node *)0x0) {
      pcVar20 = "";
    }
    plVar11 = plVar10->schema;
    if (((ulong)plVar11[1].name & 0x200) == 0) {
      ppcVar18 = (char **)(*(long *)plVar11 + 8);
    }
    else {
      ppcVar18 = &plVar11[1].dsc;
    }
    ly_vlog(local_10d0.ctx,(char *)0x0,LYVE_REFERENCE,
            "Augment%s target node \"%s\" from module \"%s\" was not found.",pcVar20,
            **(undefined8 **)plVar10,*ppcVar18);
    local_10d0.cur_mod = plVar12;
    lysc_update_path(&local_10d0,(lys_module *)0x0,(char *)0x0);
    lysc_update_path(&local_10d0,(lys_module *)0x0,(char *)0x0);
    if (plVar10->next != (lyd_node *)0x0) {
      lysc_update_path(&local_10d0,(lys_module *)0x0,(char *)0x0);
      lysc_update_path(&local_10d0,(lys_module *)0x0,(char *)0x0);
    }
  }
  if (local_10d0.augs.count == 0) {
    for (uVar27 = 0; uVar27 < local_10d0.devs.count; uVar27 = uVar27 + 1) {
      plVar10 = local_10d0.devs.field_2.dnodes[uVar27];
      lysc_update_path(&local_10d0,(lys_module *)0x0,"{deviation}");
      lysc_update_path(&local_10d0,(lys_module *)0x0,(char *)**(undefined8 **)plVar10);
      plVar14 = *(long **)&plVar10->parent->field_0;
      if ((*(byte *)((long)plVar14 + 0x79) & 2) == 0) {
        plVar14 = (long *)(*plVar14 + 8);
      }
      else {
        plVar14 = plVar14 + 0x10;
      }
      ly_vlog(local_10d0.ctx,(char *)0x0,LYVE_REFERENCE,
              "Deviation(s) target node \"%s\" from module \"%s\" was not found.",
              **(undefined8 **)plVar10,*plVar14);
      lysc_update_path(&local_10d0,(lys_module *)0x0,(char *)0x0);
      lysc_update_path(&local_10d0,(lys_module *)0x0,(char *)0x0);
    }
    LVar13 = (uint)(local_10d0.devs.count != 0) * 5;
  }
  else {
    LVar13 = LY_ENOTFOUND;
  }
LAB_0013ee95:
  ly_log_location_revert(0,0,1,0);
  ly_set_erase(&local_10d0.groupings,(_func_void_void_ptr *)0x0);
  ly_set_erase(&local_10d0.tpdf_chain,(_func_void_void_ptr *)0x0);
  if ((char)LVar13 == '\0') {
    if (local_10d0.augs.count == 0) {
      if (local_10d0.devs.count == 0) {
        ly_set_erase(&local_10d0.augs,(_func_void_void_ptr *)0x0);
        ly_set_erase(&local_10d0.devs,(_func_void_void_ptr *)0x0);
        ly_set_erase(&local_10d0.uses_augs,(_func_void_void_ptr *)0x0);
        goto LAB_0013f00d;
      }
      uVar21 = 0x68a;
    }
    else {
      uVar21 = 0x689;
    }
    ly_log(local_10d0.ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
           "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_compile.c"
           ,uVar21);
  }
  else {
    for (uVar27 = 0; uVar27 < local_10d0.augs.count; uVar27 = uVar27 + 1) {
      lysc_augment_free(local_10d0.ctx,(lysc_augment *)local_10d0.augs.field_2.dnodes[uVar27]);
    }
    ly_set_erase(&local_10d0.augs,(_func_void_void_ptr *)0x0);
    for (uVar27 = 0; uVar27 < local_10d0.devs.count; uVar27 = uVar27 + 1) {
      lysc_deviation_free(local_10d0.ctx,(lysc_deviation *)local_10d0.devs.field_2.dnodes[uVar27]);
    }
    ly_set_erase(&local_10d0.devs,(_func_void_void_ptr *)0x0);
    for (uVar27 = 0; uVar27 < local_10d0.uses_augs.count; uVar27 = uVar27 + 1) {
      lysc_augment_free(local_10d0.ctx,(lysc_augment *)local_10d0.uses_augs.field_2.dnodes[uVar27]);
    }
    ly_set_erase(&local_10d0.uses_augs,(_func_void_void_ptr *)0x0);
    for (uVar27 = 0; uVar27 < local_10d0.uses_rfns.count; uVar27 = uVar27 + 1) {
      lysc_refine_free(local_10d0.ctx,(lysc_refine *)local_10d0.uses_rfns.field_2.dnodes[uVar27]);
    }
LAB_0013f00d:
    ly_set_erase(&local_10d0.uses_rfns,(_func_void_void_ptr *)0x0);
  }
  if (LVar13 == LY_SUCCESS) {
    LVar13 = LY_SUCCESS;
  }
  else {
    lysc_module_free(&local_10d0.free_ctx,module);
    mod->compiled = (lysc_module *)0x0;
  }
  return LVar13;
}

Assistant:

LY_ERR
lys_compile(struct lys_module *mod, struct lys_depset_unres *unres)
{
    struct lysc_ctx ctx = {0};
    struct lysc_module *mod_c = NULL;
    struct lysp_module *sp;
    struct lysp_submodule *submod;
    struct lysp_node *pnode;
    struct lysp_node_grp *grp;
    LY_ARRAY_COUNT_TYPE u;
    LY_ERR ret = LY_SUCCESS;

    LY_CHECK_ARG_RET(NULL, mod, mod->parsed, !mod->compiled, mod->ctx, LY_EINVAL);

    assert(mod->implemented && mod->to_compile);

    sp = mod->parsed;
    LYSC_CTX_INIT_PMOD(ctx, sp, NULL);
    ctx.unres = unres;

    ++mod->ctx->change_count;
    mod->compiled = mod_c = calloc(1, sizeof *mod_c);
    LY_CHECK_ERR_RET(!mod_c, LOGMEM(mod->ctx), LY_EMEM);
    mod_c->mod = mod;

    /* compile augments and deviations of our module from other modules so they can be applied during compilation */
    LY_CHECK_GOTO(ret = lys_precompile_own_augments(&ctx), cleanup);
    LY_CHECK_GOTO(ret = lys_precompile_own_deviations(&ctx), cleanup);

    /* data nodes */
    LY_LIST_FOR(sp->data, pnode) {
        LY_CHECK_GOTO(ret = lys_compile_node(&ctx, pnode, NULL, 0, NULL), cleanup);
    }

    /* top-level RPCs */
    LY_LIST_FOR((struct lysp_node *)sp->rpcs, pnode) {
        LY_CHECK_GOTO(ret = lys_compile_node(&ctx, pnode, NULL, 0, NULL), cleanup);
    }

    /* top-level notifications */
    LY_LIST_FOR((struct lysp_node *)sp->notifs, pnode) {
        LY_CHECK_GOTO(ret = lys_compile_node(&ctx, pnode, NULL, 0, NULL), cleanup);
    }

    /* module extension instances */
    COMPILE_EXTS_GOTO(&ctx, sp->exts, mod_c->exts, mod_c, ret, cleanup);

    /* the same for submodules */
    LY_ARRAY_FOR(sp->includes, u) {
        submod = sp->includes[u].submodule;
        ctx.pmod = (struct lysp_module *)submod;

        LY_LIST_FOR(submod->data, pnode) {
            ret = lys_compile_node(&ctx, pnode, NULL, 0, NULL);
            LY_CHECK_GOTO(ret, cleanup);
        }

        LY_LIST_FOR((struct lysp_node *)submod->rpcs, pnode) {
            ret = lys_compile_node(&ctx, pnode, NULL, 0, NULL);
            LY_CHECK_GOTO(ret, cleanup);
        }

        LY_LIST_FOR((struct lysp_node *)submod->notifs, pnode) {
            ret = lys_compile_node(&ctx, pnode, NULL, 0, NULL);
            LY_CHECK_GOTO(ret, cleanup);
        }

        COMPILE_EXTS_GOTO(&ctx, submod->exts, mod_c->exts, mod_c, ret, cleanup);
    }
    ctx.pmod = sp;

    /* validate non-instantiated groupings from the parsed schema,
     * without it we would accept even the schemas with invalid grouping specification */
    ctx.compile_opts |= LYS_COMPILE_GROUPING;
    LY_LIST_FOR(sp->groupings, grp) {
        if (!(grp->flags & LYS_USED_GRP)) {
            LY_CHECK_GOTO(ret = lys_compile_grouping(&ctx, NULL, grp), cleanup);
        }
    }
    LY_LIST_FOR(sp->data, pnode) {
        LY_LIST_FOR((struct lysp_node_grp *)lysp_node_groupings(pnode), grp) {
            if (!(grp->flags & LYS_USED_GRP)) {
                LY_CHECK_GOTO(ret = lys_compile_grouping(&ctx, pnode, grp), cleanup);
            }
        }
    }
    LY_ARRAY_FOR(sp->includes, u) {
        submod = sp->includes[u].submodule;
        ctx.pmod = (struct lysp_module *)submod;

        LY_LIST_FOR(submod->groupings, grp) {
            if (!(grp->flags & LYS_USED_GRP)) {
                LY_CHECK_GOTO(ret = lys_compile_grouping(&ctx, NULL, grp), cleanup);
            }
        }
        LY_LIST_FOR(submod->data, pnode) {
            LY_LIST_FOR((struct lysp_node_grp *)lysp_node_groupings(pnode), grp) {
                if (!(grp->flags & LYS_USED_GRP)) {
                    LY_CHECK_GOTO(ret = lys_compile_grouping(&ctx, pnode, grp), cleanup);
                }
            }
        }
    }
    ctx.pmod = sp;

    ly_log_location_revert(0, 0, 1, 0);

    /* finish compilation for all unresolved module items in the context */
    LY_CHECK_GOTO(ret = lys_compile_unres_mod(&ctx), cleanup);

cleanup:
    ly_log_location_revert(0, 0, 1, 0);
    lys_compile_unres_mod_erase(&ctx, ret);
    if (ret) {
        lysc_module_free(&ctx.free_ctx, mod_c);
        mod->compiled = NULL;
    }
    return ret;
}